

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O3

void clean_getout(OperationConfig *config)

{
  getout *pgVar1;
  getout *__ptr;
  
  __ptr = config->url_list;
  while (__ptr != (getout *)0x0) {
    pgVar1 = __ptr->next;
    free(__ptr->url);
    __ptr->url = (char *)0x0;
    free(__ptr->outfile);
    __ptr->outfile = (char *)0x0;
    free(__ptr->infile);
    free(__ptr);
    __ptr = pgVar1;
  }
  config->url_list = (getout *)0x0;
  return;
}

Assistant:

void clean_getout(struct OperationConfig *config)
{
  struct getout *next;
  struct getout *node = config->url_list;

  while(node) {
    next = node->next;
    Curl_safefree(node->url);
    Curl_safefree(node->outfile);
    Curl_safefree(node->infile);
    Curl_safefree(node);
    node = next;
  }
  config->url_list = NULL;
}